

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O3

StringList * Rml::GetTextureSourceList_abi_cxx11_(void)

{
  long lVar1;
  StringList *in_RDI;
  pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
  *render_manager;
  long lVar2;
  
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (core_data._8_8_ != 0) {
    lVar1 = *(long *)(core_data._8_8_ + 0x28);
    for (lVar2 = *(long *)(core_data._8_8_ + 0x20); lVar2 != lVar1; lVar2 = lVar2 + 0x10) {
      RenderManagerAccess::GetTextureSourceList(*(RenderManager **)(lVar2 + 8),in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

StringList GetTextureSourceList()
{
	StringList result;
	if (!core_data)
		return result;
	for (const auto& render_manager : core_data->render_managers)
	{
		RenderManagerAccess::GetTextureSourceList(render_manager.second.get(), result);
	}
	return result;
}